

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O0

void __thiscall
LSL_RLEZ<UF>::PerformLabelingMem
          (LSL_RLEZ<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  Mat1b *pMVar2;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Mat_<int> local_580;
  allocator<unsigned_long> local_519;
  value_type_conflict2 local_518;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_510;
  int local_4f8;
  int local_4f4;
  int c_1;
  int r_2;
  MemMat<int> labels;
  int ak;
  int eak;
  int erk;
  int a;
  int ea;
  int er1;
  int er0;
  int j1;
  int j0;
  int er_2;
  int r_1;
  int er_1;
  MemMat<int> ERA;
  int c;
  int er;
  int f;
  int x1;
  int x0;
  int r;
  MemVector<int> ner;
  MemMat<int> RLC;
  MemMat<int> ER;
  Mat_<int> local_148;
  undefined1 local_e8 [8];
  MemMat<int> img;
  int cols;
  int rows;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  LSL_RLEZ<UF> *this_local;
  
  img.accesses_._92_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  img.accesses_._88_4_ =
       *(undefined4 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  cv::Mat_::operator_cast_to_Mat_
            (&local_148,(Mat_ *)(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<int>::MemMat((MemMat<int> *)local_e8,&local_148);
  cv::Mat_<int>::~Mat_(&local_148);
  MemMat<int>::MemMat((MemMat<int> *)&RLC.accesses_.field_0x58,img.accesses_._92_4_,
                      img.accesses_._88_4_);
  MemMat<int>::MemMat((MemMat<int> *)
                      &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,img.accesses_._92_4_,
                      img.accesses_._88_4_ + 1 & 0xfffffffe);
  MemVector<int>::MemVector((MemVector<int> *)&x0,(long)(int)img.accesses_._92_4_);
  for (x1 = 0; x1 < (int)img.accesses_._92_4_; x1 = x1 + 1) {
    er = 0;
    ERA.accesses_._92_4_ = 0;
    for (ERA.accesses_._88_4_ = 0; uVar3 = img.accesses_._88_4_,
        (int)ERA.accesses_._88_4_ < (int)img.accesses_._88_4_;
        ERA.accesses_._88_4_ = ERA.accesses_._88_4_ + 1) {
      piVar6 = MemMat<int>::operator()((MemMat<int> *)local_e8,x1,ERA.accesses_._88_4_);
      uVar3 = ERA.accesses_._88_4_;
      iVar4 = *piVar6;
      if ((uint)(0 < iVar4) != er) {
        piVar6 = MemMat<int>::operator()
                           ((MemMat<int> *)
                            &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,x1,ERA.accesses_._92_4_);
        *piVar6 = uVar3;
        ERA.accesses_._92_4_ = ERA.accesses_._92_4_ + 1;
      }
      uVar3 = ERA.accesses_._92_4_;
      piVar6 = MemMat<int>::operator()
                         ((MemMat<int> *)&RLC.accesses_.field_0x58,x1,ERA.accesses_._88_4_);
      *piVar6 = uVar3;
      er = (uint)(0 < iVar4);
    }
    if (er != 0) {
      piVar6 = MemMat<int>::operator()
                         ((MemMat<int> *)
                          &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,x1,ERA.accesses_._92_4_);
      *piVar6 = uVar3;
    }
    iVar4 = ERA.accesses_._92_4_ + er;
    ERA.accesses_._92_4_ = iVar4;
    piVar6 = MemVector<int>::operator[]((MemVector<int> *)&x0,x1);
    *piVar6 = iVar4;
  }
  MemMat<int>::MemMat((MemMat<int> *)&r_1,img.accesses_._92_4_,img.accesses_._88_4_ + 1,0);
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar2->field_0x8;
  iVar1 = *(int *)&pMVar2->field_0xc;
  UF::MemAlloc(((iVar4 + 1) - (iVar4 + 1 >> 0x1f) >> 1) * ((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) +
               1);
  UF::MemSetup();
  for (er_2 = 1; piVar6 = MemVector<int>::operator[]((MemVector<int> *)&x0,0), er_2 <= *piVar6;
      er_2 = er_2 + 2) {
    uVar5 = UF::MemNewLabel();
    puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&r_1,0,er_2);
    *puVar7 = uVar5;
  }
  for (j0 = 1; j0 < (int)img.accesses_._92_4_; j0 = j0 + 1) {
    for (j1 = 1; piVar6 = MemVector<int>::operator[]((MemVector<int> *)&x0,j0), j1 <= *piVar6;
        j1 = j1 + 2) {
      piVar6 = MemMat<int>::operator()
                         ((MemMat<int> *)
                          &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,j0,j1 + -1);
      er0 = *piVar6;
      piVar6 = MemMat<int>::operator()
                         ((MemMat<int> *)
                          &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,j0,j1);
      er1 = *piVar6 + -1;
      if (0 < er0) {
        er0 = er0 + -1;
      }
      if (er1 < img.accesses_._88_4_ + -1) {
        er1 = *piVar6;
      }
      piVar6 = MemMat<int>::operator()((MemMat<int> *)&RLC.accesses_.field_0x58,j0 + -1,er0);
      ea = *piVar6;
      piVar6 = MemMat<int>::operator()((MemMat<int> *)&RLC.accesses_.field_0x58,j0 + -1,er1);
      a = *piVar6;
      if (ea % 2 == 0) {
        ea = ea + 1;
      }
      if (a % 2 == 0) {
        a = a + -1;
      }
      if (a < ea) {
        uVar5 = UF::MemNewLabel();
        puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&r_1,j0,j1);
        *puVar7 = uVar5;
      }
      else {
        puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&r_1,j0 + -1,ea);
        eak = UF::MemFindRoot(*puVar7);
        while (ak = ea + 2, ak <= a) {
          puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&r_1,j0 + -1,ak);
          labels.accesses_._92_4_ = *puVar7;
          labels.accesses_._88_4_ = UF::MemFindRoot(labels.accesses_._92_4_);
          if (eak < (int)labels.accesses_._88_4_) {
            UF::MemUpdateTable(labels.accesses_._88_4_,eak);
          }
          ea = ak;
          if ((int)labels.accesses_._88_4_ < eak) {
            UF::MemUpdateTable(eak,labels.accesses_._88_4_);
            eak = labels.accesses_._88_4_;
          }
        }
        piVar6 = MemMat<int>::operator()((MemMat<int> *)&r_1,j0,j1);
        *piVar6 = eak;
      }
    }
  }
  uVar5 = UF::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
  MemMat<int>::MemMat((MemMat<int> *)&c_1,img.accesses_._92_4_,img.accesses_._88_4_);
  for (local_4f4 = 0; local_4f4 < (int)img.accesses_._92_4_; local_4f4 = local_4f4 + 1) {
    for (local_4f8 = 0; iVar4 = local_4f4, local_4f8 < (int)img.accesses_._88_4_;
        local_4f8 = local_4f8 + 1) {
      piVar6 = MemMat<int>::operator()((MemMat<int> *)&RLC.accesses_.field_0x58,local_4f4,local_4f8)
      ;
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&r_1,iVar4,*piVar6);
      uVar5 = UF::MemGetLabel(*puVar7);
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)&c_1,local_4f4,local_4f8);
      *puVar7 = uVar5;
    }
  }
  local_518 = 0;
  std::allocator<unsigned_long>::allocator(&local_519);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_510,4,&local_518,&local_519);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(accesses,&local_510);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_510);
  std::allocator<unsigned_long>::~allocator(&local_519);
  dVar10 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_e8);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,0);
  *pvVar8 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
  dVar10 = MemMat<int>::GetTotalAccesses((MemMat<int> *)&c_1);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,1);
  *pvVar8 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
  dVar10 = UF::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,2);
  *pvVar8 = (long)dVar10 | (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f;
  dVar10 = MemMat<int>::GetTotalAccesses((MemMat<int> *)&RLC.accesses_.field_0x58);
  dVar11 = MemMat<int>::GetTotalAccesses
                     ((MemMat<int> *)
                      &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  dVar12 = MemVector<int>::GetTotalAccesses((MemVector<int> *)&x0);
  dVar13 = MemMat<int>::GetTotalAccesses((MemMat<int> *)&r_1);
  dVar13 = dVar10 + dVar11 + dVar12 + dVar13;
  uVar9 = (ulong)dVar13;
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](accesses,3);
  *pvVar8 = uVar9 | (long)(dVar13 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_580,(MemMat<int> *)&c_1);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_580);
  cv::Mat_<int>::~Mat_(&local_580);
  UF::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)&c_1);
  MemMat<int>::~MemMat((MemMat<int> *)&r_1);
  MemVector<int>::~MemVector((MemVector<int> *)&x0);
  MemMat<int>::~MemMat
            ((MemMat<int> *)
             &ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  MemMat<int>::~MemMat((MemMat<int> *)&RLC.accesses_.field_0x58);
  MemMat<int>::~MemMat((MemMat<int> *)local_e8);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }